

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindLibraryCommand.cxx
# Opt level: O1

void __thiscall
cmFindLibraryCommand::cmFindLibraryCommand(cmFindLibraryCommand *this,cmExecutionStatus *status)

{
  string local_40;
  
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"find_library","");
  cmFindBase::cmFindBase(&this->super_cmFindBase,&local_40,status);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  (this->super_cmFindBase)._vptr_cmFindBase = (_func_int **)&PTR__cmFindBase_008ccc68;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).EnvironmentPath,0,
             (char *)(this->super_cmFindBase).EnvironmentPath._M_string_length,0x6f04d5);
  (this->super_cmFindBase).NamesPerDirAllowed = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmFindBase).VariableDocumentation,0,
             (char *)(this->super_cmFindBase).VariableDocumentation._M_string_length,0x70b12d);
  (this->super_cmFindBase).VariableType = FILEPATH;
  return;
}

Assistant:

cmFindLibraryCommand::cmFindLibraryCommand(cmExecutionStatus& status)
  : cmFindBase("find_library", status)
{
  this->EnvironmentPath = "LIB";
  this->NamesPerDirAllowed = true;
  this->VariableDocumentation = "Path to a library.";
  this->VariableType = cmStateEnums::FILEPATH;
}